

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O2

void __thiscall EmptyRoomListView::getParams(EmptyRoomListView *this)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Fill in the following details:\n");
  std::operator<<(poVar3,"Start time -> ");
  DateTime::inputValidate(&(this->params).start);
  std::operator<<((ostream *)&std::cout,"End time -> ");
  DateTime::inputValidate(&(this->params).end);
  std::operator<<((ostream *)&std::cout,"Enter strength: ");
  iVar2 = Input::getInt();
  (this->params).strength = iVar2;
  std::operator<<((ostream *)&std::cout,"Audio required? (y/n): ");
  cVar1 = Input::getChar();
  (this->params).audio = cVar1 == 'y';
  std::operator<<((ostream *)&std::cout,"Video required? (y/n): ");
  cVar1 = Input::getChar();
  (this->params).video = cVar1 == 'y';
  return;
}

Assistant:

void EmptyRoomListView::getParams() {
    cout << "Fill in the following details:\n"
         << "Start time -> ";
    params.start.inputValidate();
    cout << "End time -> ";
    params.end.inputValidate();
    cout << "Enter strength: ";
    params.strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    params.audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    params.video = (Input::getChar() == 'y');
}